

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uchar *k;
  FILE *__stream;
  AES_KEY *key_00;
  char *__s;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  uint uVar9;
  uint uVar11;
  undefined1 auVar10 [16];
  uint uVar12;
  block input;
  int n;
  AES_KEY key;
  char filename [1001];
  
  dpf_seed((block *)0x0);
  key.rd_key[0][0] = _DAT_00103030;
  key.rd_key[0][1] = _UNK_00103038;
  auVar7 = aeskeygenassist((undefined1  [16])_DAT_00103030,1);
  uVar8 = auVar7._12_4_;
  auVar10._4_4_ = uVar8;
  auVar10._0_4_ = uVar8;
  auVar10._8_4_ = uVar8;
  auVar10._12_4_ = uVar8;
  key.rd_key[1] = (block)(auVar10 ^ _DAT_00103040);
  auVar7 = aeskeygenassist((undefined1  [16])key.rd_key[1],2);
  uVar9 = (uint)key.rd_key[1][0];
  uVar11 = (uint)key.rd_key[1][1] ^ key.rd_key[1][0]._4_4_;
  uVar12 = auVar7._12_4_;
  key.rd_key[2][0]._0_4_ = uVar9 ^ uVar12;
  key.rd_key[2][0]._4_4_ = uVar9 ^ key.rd_key[1][0]._4_4_ ^ uVar12;
  key.rd_key[2][1]._0_4_ = uVar9 ^ uVar11 ^ uVar12;
  key.rd_key[2][1]._4_4_ = uVar11 ^ key.rd_key[1][1]._4_4_ ^ uVar9 ^ uVar12;
  auVar7._4_4_ = key.rd_key[2][0]._4_4_;
  auVar7._0_4_ = (uint)key.rd_key[2][0];
  auVar7._8_4_ = (uint)key.rd_key[2][1];
  auVar7._12_4_ = key.rd_key[2][1]._4_4_;
  auVar7 = aeskeygenassist(auVar7,4);
  uVar9 = auVar7._12_4_;
  key.rd_key[3][0]._0_4_ = (uint)key.rd_key[2][0] ^ uVar9;
  key.rd_key[3][0]._4_4_ = (uint)key.rd_key[2][0] ^ key.rd_key[2][0]._4_4_ ^ uVar9;
  key.rd_key[3][1]._0_4_ =
       (uint)key.rd_key[2][0] ^ (uint)key.rd_key[2][1] ^ key.rd_key[2][0]._4_4_ ^ uVar9;
  key.rd_key[3][1]._4_4_ =
       (uint)key.rd_key[2][1] ^ key.rd_key[2][0]._4_4_ ^
       key.rd_key[2][1]._4_4_ ^ (uint)key.rd_key[2][0] ^ uVar9;
  auVar7 = aeskeygenassist((undefined1  [16])key.rd_key[3],8);
  uVar9 = auVar7._12_4_;
  key.rd_key[4][0]._0_4_ = (uint)key.rd_key[3][0] ^ uVar9;
  key.rd_key[4][0]._4_4_ = (uint)key.rd_key[3][0] ^ key.rd_key[3][0]._4_4_ ^ uVar9;
  key.rd_key[4][1]._0_4_ =
       (uint)key.rd_key[3][0] ^ (uint)key.rd_key[3][1] ^ key.rd_key[3][0]._4_4_ ^ uVar9;
  key.rd_key[4][1]._4_4_ =
       (uint)key.rd_key[3][1] ^ key.rd_key[3][0]._4_4_ ^
       key.rd_key[3][1]._4_4_ ^ (uint)key.rd_key[3][0] ^ uVar9;
  auVar2._4_4_ = key.rd_key[4][0]._4_4_;
  auVar2._0_4_ = (uint)key.rd_key[4][0];
  auVar2._8_4_ = (uint)key.rd_key[4][1];
  auVar2._12_4_ = key.rd_key[4][1]._4_4_;
  auVar7 = aeskeygenassist(auVar2,0x10);
  uVar9 = auVar7._12_4_;
  key.rd_key[5][0]._0_4_ = (uint)key.rd_key[4][0] ^ uVar9;
  key.rd_key[5][0]._4_4_ = (uint)key.rd_key[4][0] ^ key.rd_key[4][0]._4_4_ ^ uVar9;
  key.rd_key[5][1]._0_4_ =
       (uint)key.rd_key[4][0] ^ (uint)key.rd_key[4][1] ^ key.rd_key[4][0]._4_4_ ^ uVar9;
  key.rd_key[5][1]._4_4_ =
       (uint)key.rd_key[4][1] ^ key.rd_key[4][0]._4_4_ ^
       key.rd_key[4][1]._4_4_ ^ (uint)key.rd_key[4][0] ^ uVar9;
  auVar7 = aeskeygenassist((undefined1  [16])key.rd_key[5],0x20);
  uVar9 = auVar7._12_4_;
  key.rd_key[6][0]._0_4_ = (uint)key.rd_key[5][0] ^ uVar9;
  key.rd_key[6][0]._4_4_ = (uint)key.rd_key[5][0] ^ key.rd_key[5][0]._4_4_ ^ uVar9;
  key.rd_key[6][1]._0_4_ =
       (uint)key.rd_key[5][0] ^ (uint)key.rd_key[5][1] ^ key.rd_key[5][0]._4_4_ ^ uVar9;
  key.rd_key[6][1]._4_4_ =
       (uint)key.rd_key[5][1] ^ key.rd_key[5][0]._4_4_ ^
       key.rd_key[5][1]._4_4_ ^ (uint)key.rd_key[5][0] ^ uVar9;
  auVar3._4_4_ = key.rd_key[6][0]._4_4_;
  auVar3._0_4_ = (uint)key.rd_key[6][0];
  auVar3._8_4_ = (uint)key.rd_key[6][1];
  auVar3._12_4_ = key.rd_key[6][1]._4_4_;
  auVar7 = aeskeygenassist(auVar3,0x40);
  uVar9 = auVar7._12_4_;
  key.rd_key[7][0]._0_4_ = (uint)key.rd_key[6][0] ^ uVar9;
  key.rd_key[7][0]._4_4_ = (uint)key.rd_key[6][0] ^ key.rd_key[6][0]._4_4_ ^ uVar9;
  key.rd_key[7][1]._0_4_ =
       (uint)key.rd_key[6][0] ^ (uint)key.rd_key[6][1] ^ key.rd_key[6][0]._4_4_ ^ uVar9;
  key.rd_key[7][1]._4_4_ =
       (uint)key.rd_key[6][1] ^ key.rd_key[6][0]._4_4_ ^
       key.rd_key[6][1]._4_4_ ^ (uint)key.rd_key[6][0] ^ uVar9;
  auVar7 = aeskeygenassist((undefined1  [16])key.rd_key[7],0x80);
  uVar9 = auVar7._12_4_;
  key.rd_key[8][0]._0_4_ = (uint)key.rd_key[7][0] ^ uVar9;
  key.rd_key[8][0]._4_4_ = (uint)key.rd_key[7][0] ^ key.rd_key[7][0]._4_4_ ^ uVar9;
  key.rd_key[8][1]._0_4_ =
       (uint)key.rd_key[7][0] ^ (uint)key.rd_key[7][1] ^ key.rd_key[7][0]._4_4_ ^ uVar9;
  key.rd_key[8][1]._4_4_ =
       (uint)key.rd_key[7][1] ^ key.rd_key[7][0]._4_4_ ^
       key.rd_key[7][1]._4_4_ ^ (uint)key.rd_key[7][0] ^ uVar9;
  auVar4._4_4_ = key.rd_key[8][0]._4_4_;
  auVar4._0_4_ = (uint)key.rd_key[8][0];
  auVar4._8_4_ = (uint)key.rd_key[8][1];
  auVar4._12_4_ = key.rd_key[8][1]._4_4_;
  auVar7 = aeskeygenassist(auVar4,0x1b);
  uVar9 = auVar7._12_4_;
  key.rd_key[9][0]._0_4_ = (uint)key.rd_key[8][0] ^ uVar9;
  key.rd_key[9][0]._4_4_ = (uint)key.rd_key[8][0] ^ key.rd_key[8][0]._4_4_ ^ uVar9;
  key.rd_key[9][1]._0_4_ =
       (uint)key.rd_key[8][0] ^ (uint)key.rd_key[8][1] ^ key.rd_key[8][0]._4_4_ ^ uVar9;
  key.rd_key[9][1]._4_4_ =
       (uint)key.rd_key[8][1] ^ key.rd_key[8][0]._4_4_ ^
       key.rd_key[8][1]._4_4_ ^ (uint)key.rd_key[8][0] ^ uVar9;
  auVar7 = aeskeygenassist((undefined1  [16])key.rd_key[9],0x36);
  uVar9 = auVar7._12_4_;
  key.rd_key[10][0]._0_4_ = (uint)key.rd_key[9][0] ^ uVar9;
  key.rd_key[10][0]._4_4_ = (uint)key.rd_key[9][0] ^ key.rd_key[9][0]._4_4_ ^ uVar9;
  key.rd_key[10][1]._0_4_ =
       (uint)key.rd_key[9][0] ^ (uint)key.rd_key[9][1] ^ key.rd_key[9][0]._4_4_ ^ uVar9;
  key.rd_key[10][1]._4_4_ =
       (uint)key.rd_key[9][1] ^ key.rd_key[9][0]._4_4_ ^
       key.rd_key[9][1]._4_4_ ^ (uint)key.rd_key[9][0] ^ uVar9;
  key.rounds = 10;
  if (argc == 3) {
    __isoc99_sscanf(argv[1],"%d",&n);
    __isoc99_sscanf(argv[2],"%s",filename);
    k = (uchar *)malloc((long)(n * 0x12 + -0x5c));
    if (k == (uchar *)0x0) {
      __s = "Failed to allocate a memory space.";
    }
    else {
      __stream = fopen(filename,"rb");
      if (__stream != (FILE *)0x0) {
        fread(k,(long)(n * 0x12 + -0x5c),1,__stream);
        fclose(__stream);
        key_00 = &key;
        EVALFULL(key_00,k);
        uVar1 = (long)(1 << ((byte)n & 0x1f)) / 0x80;
        uVar6 = 0;
        uVar5 = uVar1 & 0xffffffff;
        if ((int)uVar1 < 1) {
          uVar5 = uVar6;
        }
        for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
          input[1] = (longlong)k;
          input[0] = (longlong)key_00;
          dpf_cbnotnewline(input);
        }
        return 0;
      }
      __s = "Failed to open the file.";
    }
  }
  else {
    __s = "format: fsseval N filename";
  }
  puts(__s);
  exit(0);
}

Assistant:

int main(int argc, char** argv){
	long long userkey1 = 597349; long long userkey2 = 121379; 
	block userkey = dpf_make_block(userkey1, userkey2);

	dpf_seed(NULL);

	AES_KEY key;
	AES_set_encrypt_key(userkey, &key);

	if(argc != 3){
		printf("format: fsseval N filename\n");
		exit(0);
	}

	int n;
	char filename[1001];
	sscanf(argv[1], "%d", &n);
	sscanf(argv[2], "%s", filename);

	unsigned char *k = (unsigned char*) malloc(getsize(n));

	if(k == NULL){
		printf("Failed to allocate a memory space.\n");
		exit(0);
	}

	FILE *fp = fopen(filename, "rb");

	if(fp == NULL){
		printf("Failed to open the file.\n");
		exit(0);
	}

	fread(k, getsize(n), 1, fp);
	fclose(fp);

	block *resf;
	resf = EVALFULL(&key, k);

	int j;
	int totalblocknumber = (1 << n) / 128;
	for(j = 0; j < totalblocknumber; j++){
		dpf_cbnotnewline(resf[j]);
	}

	return 0;
}